

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorExprTree.h
# Opt level: O0

void __thiscall phaeton::IdentifierExpr::~IdentifierExpr(IdentifierExpr *this)

{
  IdentifierExpr *this_local;
  
  (this->super_ExpressionNode)._vptr_ExpressionNode = (_func_int **)&PTR__IdentifierExpr_001f9b30;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->IndexPairs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Indices);
  std::__cxx11::string::~string((string *)&this->Name);
  ExpressionNode::~ExpressionNode(&this->super_ExpressionNode);
  return;
}

Assistant:

IdentifierExpr(const std::string &Name, const ExprDims &ED)
      : ExpressionNode(EXPR_KIND_Identifier, /*NumChildren=*/0, ED), Name(Name),
        Permute(false), ElementIndexPosition(-1) {}